

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::scatter<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                 vector<int,_std::allocator<int>_> *msgs,int root,comm *comm)

{
  int iVar1;
  size_type sVar2;
  ulong local_30;
  size_t size;
  comm *comm_local;
  vector<int,_std::allocator<int>_> *pvStack_18;
  int root_local;
  vector<int,_std::allocator<int>_> *msgs_local;
  vector<int,_std::allocator<int>_> *result;
  
  size = (size_t)comm;
  comm_local._4_4_ = root;
  pvStack_18 = msgs;
  msgs_local = __return_storage_ptr__;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(msgs);
  iVar1 = mxx::comm::size((comm *)size);
  local_30 = sVar2 / (ulong)(long)iVar1;
  iVar1 = mxx::comm::rank((comm *)size);
  if (iVar1 == 0) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvStack_18);
    iVar1 = mxx::comm::size((comm *)size);
    if (sVar2 % (ulong)(long)iVar1 != 0) {
      assert_fail("comm.rank() != 0 || msgs.size() % (size_t)comm.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,199,"scatter");
    }
  }
  bcast<unsigned_long>(&local_30,comm_local._4_4_,(comm *)size);
  scatter<int>(__return_storage_ptr__,pvStack_18,local_30,comm_local._4_4_,(comm *)size);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    size_t size = msgs.size() / comm.size();
    MXX_ASSERT(comm.rank() != 0 || msgs.size() % (size_t)comm.size() == 0);
    mxx::bcast(size, root, comm);
    // now everybody knows the size
    std::vector<T> result = scatter(msgs, size, root, comm);
    return result;
}